

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void __thiscall pbrt::Image::FlipY(Image *this)

{
  float fVar1;
  uchar uVar2;
  uint16_t uVar3;
  int iVar4;
  PixelFormat PVar5;
  uchar *puVar6;
  Half *pHVar7;
  float *pfVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  size_t sVar13;
  long lVar14;
  long lVar15;
  
  iVar10 = 0;
  iVar12 = -1;
  do {
    if ((this->resolution).super_Tuple2<pbrt::Point2,_int>.y / 2 <= iVar10) {
      return;
    }
    iVar9 = 0;
    while( true ) {
      iVar4 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
      if (iVar4 <= iVar9) break;
      sVar13 = (this->channelNames).nStored;
      lVar11 = (long)((iVar10 * iVar4 + iVar9) * (int)sVar13);
      lVar14 = (long)((((this->resolution).super_Tuple2<pbrt::Point2,_int>.y + iVar12) * iVar4 +
                      iVar9) * (int)sVar13);
      for (lVar15 = 0; lVar15 < (int)sVar13; lVar15 = lVar15 + 1) {
        PVar5 = this->format;
        if (PVar5 == Float) {
          pfVar8 = (this->p32).ptr;
          fVar1 = pfVar8[lVar11];
          pfVar8[lVar11] = pfVar8[lVar14];
          pfVar8[lVar14] = fVar1;
        }
        else if (PVar5 == Half) {
          pHVar7 = (this->p16).ptr;
          uVar3 = pHVar7[lVar11].h;
          pHVar7[lVar11].h = pHVar7[lVar14].h;
          pHVar7[lVar14].h = uVar3;
        }
        else {
          if (PVar5 != U256) {
            LogFatal(Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                     ,0x305,"unexpected format");
          }
          puVar6 = (this->p8).ptr;
          uVar2 = puVar6[lVar11];
          puVar6[lVar11] = puVar6[lVar14];
          puVar6[lVar14] = uVar2;
          sVar13 = (this->channelNames).nStored;
        }
        lVar11 = lVar11 + 1;
        lVar14 = lVar14 + 1;
      }
      iVar9 = iVar9 + 1;
    }
    iVar10 = iVar10 + 1;
    iVar12 = iVar12 + -1;
  } while( true );
}

Assistant:

void Image::FlipY() {
    for (int y = 0; y < resolution.y / 2; ++y) {
        for (int x = 0; x < resolution.x; ++x) {
            size_t o1 = PixelOffset({x, y}), o2 = PixelOffset({x, resolution.y - 1 - y});
            for (int c = 0; c < NChannels(); ++c) {
                if (Is8Bit(format))
                    pstd::swap(p8[o1 + c], p8[o2 + c]);
                else if (Is16Bit(format))
                    pstd::swap(p16[o1 + c], p16[o2 + c]);
                else if (Is32Bit(format))
                    pstd::swap(p32[o1 + c], p32[o2 + c]);
                else
                    LOG_FATAL("unexpected format");
            }
        }
    }
}